

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O3

bool __thiscall QLayoutPrivate::checkLayout(QLayoutPrivate *this,QLayout *otherLayout)

{
  if (otherLayout == (QLayout *)0x0) {
    checkLayout();
  }
  else {
    if (*(QLayout **)&this->field_0x8 != otherLayout) {
      return true;
    }
    checkLayout();
  }
  return false;
}

Assistant:

bool QLayoutPrivate::checkLayout(QLayout *otherLayout) const
{
    Q_Q(const QLayout);
    if (Q_UNLIKELY(!otherLayout)) {
        qWarning("QLayout: Cannot add a null layout to %s/%ls",
                 q->metaObject()->className(), qUtf16Printable(q->objectName()));
        return false;
    }
    if (Q_UNLIKELY(otherLayout == q)) {
        qWarning("QLayout: Cannot add layout %s/%ls to itself",
                 q->metaObject()->className(), qUtf16Printable(q->objectName()));
        return false;
    }
    return true;
}